

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

string * __thiscall
cfd::core::Privkey::ConvertWif_abi_cxx11_
          (string *__return_storage_ptr__,Privkey *this,NetType net_type,bool is_compressed)

{
  CfdError error_code;
  uchar *priv_key;
  size_t priv_key_len;
  undefined8 uVar1;
  char *wally_string;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff00;
  string *__return_storage_ptr___00;
  CfdException *this_00;
  allocator local_b9;
  string local_b8 [32];
  string local_98;
  CfdSourceLocation local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  CfdError local_34;
  WallyUtil *pWStack_30;
  int ret;
  char *wif_ptr;
  uint32_t flags;
  uint32_t prefix;
  bool is_compressed_local;
  Privkey *pPStack_18;
  NetType net_type_local;
  Privkey *this_local;
  string *wif;
  
  wif_ptr._4_4_ = 0xef;
  if (net_type == kMainnet) {
    wif_ptr._4_4_ = 0x80;
  }
  wif_ptr._0_4_ = (byte)~is_compressed & 1;
  pWStack_30 = (WallyUtil *)0x0;
  this_00 = (CfdException *)__return_storage_ptr__;
  flags._3_1_ = is_compressed;
  prefix = net_type;
  pPStack_18 = this;
  this_local = (Privkey *)__return_storage_ptr__;
  ByteData::GetBytes(&local_50,&this->data_);
  priv_key = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x450730);
  priv_key_len = ByteData::GetDataSize(&this->data_);
  error_code = wally_wif_from_bytes
                         (priv_key,priv_key_len,wif_ptr._4_4_,(uint)wif_ptr,
                          (char **)&stack0xffffffffffffffd0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff00);
  local_34 = error_code;
  if (error_code == kCfdSuccess) {
    WallyUtil::ConvertStringAndFree_abi_cxx11_((string *)this_00,pWStack_30,wally_string);
    return __return_storage_ptr__;
  }
  local_78.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_key.cpp"
               ,0x2f);
  local_78.filename = local_78.filename + 1;
  local_78.line = 0x110;
  local_78.funcname = "ConvertWif";
  __return_storage_ptr___00 = &local_98;
  ByteData::GetHex_abi_cxx11_(__return_storage_ptr___00,&this->data_);
  logger::warn<int&,std::__cxx11::string>
            (&local_78,"wally_wif_from_bytes error. ret={} bytes={}.",&local_34,
             __return_storage_ptr___00);
  ::std::__cxx11::string::~string((string *)&local_98);
  uVar1 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_b8,"Error Private key to WIF.",&local_b9);
  CfdException::CfdException(this_00,error_code,__return_storage_ptr___00);
  __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::string Privkey::ConvertWif(NetType net_type, bool is_compressed) const {
  uint32_t prefix = (net_type == kMainnet ? kPrefixMainnet : kPrefixTestnet);
  uint32_t flags =
      (is_compressed ? WALLY_WIF_FLAG_COMPRESSED
                     : WALLY_WIF_FLAG_UNCOMPRESSED);
  char *wif_ptr = NULL;

  int ret = wally_wif_from_bytes(
      data_.GetBytes().data(), data_.GetDataSize(), prefix, flags, &wif_ptr);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_wif_from_bytes error. ret={} bytes={}.", ret,
        data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Error Private key to WIF.");
  }
  std::string wif = WallyUtil::ConvertStringAndFree(wif_ptr);
  return wif;
}